

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall presolve::HPresolve::scaleMIP(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  pointer piVar1;
  HighsLp *pHVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pHVar2 = this->model;
  if (0 < pHVar2->num_row_) {
    lVar7 = 0;
    do {
      if ((((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7] == '\0') &&
          (iVar3 = (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7], 0 < iVar3)) &&
         ((this->rowsizeImplInt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] +
          (this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7] != iVar3)) {
        getRowPositions(this,(HighsInt)lVar7,&this->rowpositions);
        piVar1 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar4 = (long)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1;
        if (lVar4 == 0) {
          dVar9 = 0.0;
        }
        else {
          lVar4 = lVar4 >> 2;
          dVar9 = 0.0;
          lVar6 = 0;
          do {
            iVar3 = piVar1[lVar6];
            if (((this->model->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3]] == kContinuous) &&
               (dVar10 = ABS((this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[iVar3]), dVar9 <= dVar10)) {
              dVar9 = dVar10;
            }
            lVar6 = lVar6 + 1;
          } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
        }
        dVar9 = log2(dVar9);
        dVar9 = round(-dVar9);
        dVar9 = exp2(dVar9);
        pHVar2 = this->model;
        if ((dVar9 != 1.0) || (NAN(dVar9))) {
          uVar8 = -(ulong)(INFINITY <=
                          (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
          scaleStoredRow(this,(HighsInt)lVar7,
                         (double)(~uVar8 & (ulong)dVar9 | (ulong)-dVar9 & uVar8),false);
          pHVar2 = this->model;
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pHVar2->num_row_);
  }
  if (0 < pHVar2->num_col_) {
    lVar7 = 0;
    do {
      if ((((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7] == '\0') &&
          (0 < (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7])) &&
         ((pHVar2->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[lVar7] == kContinuous)) {
        lVar4 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7];
        if (lVar4 == -1) {
          dVar9 = 0.0;
        }
        else {
          pdVar5 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar4;
          dVar9 = 0.0;
          do {
            if (dVar9 <= ABS(*pdVar5)) {
              dVar9 = ABS(*pdVar5);
            }
            iVar3 = (int)lVar4;
            lVar4 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar3];
            pdVar5 = pdVar5 + (lVar4 - iVar3);
          } while (lVar4 != -1);
        }
        dVar9 = log2(dVar9);
        dVar9 = round(-dVar9);
        dVar9 = exp2(dVar9);
        if ((dVar9 != 1.0) || (NAN(dVar9))) {
          transformColumn(this,postsolve_stack,(HighsInt)lVar7,dVar9,0.0);
        }
      }
      lVar7 = lVar7 + 1;
      pHVar2 = this->model;
    } while (lVar7 < pHVar2->num_col_);
  }
  return;
}

Assistant:

void HPresolve::scaleMIP(HighsPostsolveStack& postsolve_stack) {
  for (HighsInt i = 0; i < model->num_row_; ++i) {
    if (rowDeleted[i] || rowsize[i] < 1 ||
        rowsizeInteger[i] + rowsizeImplInt[i] == rowsize[i])
      continue;

    storeRow(i);

    double maxAbsVal = 0.0;

    for (size_t j = 0; j < rowpositions.size(); ++j) {
      HighsInt nzPos = rowpositions[j];
      if (model->integrality_[Acol[nzPos]] != HighsVarType::kContinuous)
        continue;

      maxAbsVal = std::max(std::abs(Avalue[nzPos]), maxAbsVal);
    }

    assert(maxAbsVal != 0.0);

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    if (model->row_upper_[i] == kHighsInf) scale = -scale;

    scaleStoredRow(i, scale);
  }

  for (HighsInt i = 0; i < model->num_col_; ++i) {
    if (colDeleted[i] || colsize[i] < 1 ||
        model->integrality_[i] != HighsVarType::kContinuous)
      continue;

    double maxAbsVal = 0;

    for (const HighsSliceNonzero& nonz : getColumnVector(i)) {
      maxAbsVal = std::max(std::abs(nonz.value()), maxAbsVal);
    }

    double scale = std::exp2(std::round(-std::log2(maxAbsVal)));
    if (scale == 1.0) continue;

    transformColumn(postsolve_stack, i, scale, 0.0);
  }
}